

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

SegmentBuilder * __thiscall capnp::_::BuilderArena::getSegment(BuilderArena *this,SegmentId id)

{
  MultiSegmentState *pMVar1;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar2;
  ulong uVar3;
  SegmentBuilder *pSVar4;
  SegmentId id_local;
  Fault f;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  
  if (id.value == 0) {
    pSVar4 = &this->segment0;
  }
  else {
    pMVar1 = (this->moreSegments).ptr.ptr;
    id_local = id;
    if (pMVar1 == (MultiSegmentState *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xdd,FAILED,(char *)0x0,"\"invalid segment id\", id.value",
                 (char (*) [19])"invalid segment id",&id_local.value);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    _kjCondition.left = id.value - 1;
    uVar3 = (ulong)_kjCondition.left;
    pOVar2 = (pMVar1->builders).builder.ptr;
    _kjCondition.right = (long)(pMVar1->builders).builder.pos - (long)pOVar2 >> 4;
    _kjCondition.op.content.ptr = " < ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = uVar3 < _kjCondition.right;
    if (_kjCondition.right <= uVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,char_const(&)[19],unsigned_int&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xda,FAILED,"id.value - 1 < s.get()->builders.size()",
                 "_kjCondition,\"invalid segment id\", id.value",&_kjCondition,
                 (char (*) [19])"invalid segment id",&id_local.value);
      kj::_::Debug::Fault::fatal(&f);
    }
    pSVar4 = pOVar2[uVar3].ptr;
  }
  return pSVar4;
}

Assistant:

SegmentBuilder* BuilderArena::getSegment(SegmentId id) {
  // This method is allowed to fail if the segment ID is not valid.
  if (id == SegmentId(0)) {
    return &segment0;
  } else {
    KJ_IF_SOME(s, moreSegments) {
      KJ_REQUIRE(id.value - 1 < s.get()->builders.size(), "invalid segment id", id.value);
      return const_cast<SegmentBuilder*>(s.get()->builders[id.value - 1].get());
    } else {
      KJ_FAIL_REQUIRE("invalid segment id", id.value);
    }
  }